

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::Bloaty::AddDebugFilename(Bloaty *this,string *filename)

{
  mapped_type *pmVar1;
  Arg *in_R8;
  string_view format;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> object_file;
  string build_id;
  undefined1 local_90 [16];
  InternalMetadataWithArena local_80;
  long local_78 [2];
  string local_68;
  Rep *local_48;
  Arena *local_40;
  
  GetObjectFile((Bloaty *)local_90,(string *)this);
  (*(*(_func_int ***)local_90._0_8_)[2])(local_90 + 8);
  if (local_80.
      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      .ptr_ != (void *)0x0) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->debug_files_,(key_type *)(local_90 + 8));
    std::__cxx11::string::_M_assign((string *)pmVar1);
    if ((long *)local_90._8_8_ != local_78) {
      operator_delete((void *)local_90._8_8_,local_78[0] + 1);
    }
    if ((InputFileFactory *)local_90._0_8_ != (InputFileFactory *)0x0) {
      (*(*(_func_int ***)local_90._0_8_)[1])();
    }
    return;
  }
  local_40 = (Arena *)(filename->_M_dataplus)._M_p;
  local_48 = (Rep *)filename->_M_string_length;
  format._M_str = (char *)&local_48;
  format._M_len = (size_t)"File \'$0\' has no build ID, cannot be used as a debug file";
  absl::Substitute_abi_cxx11_(&local_68,(absl *)0x39,format,in_R8);
  Throw(local_68._M_dataplus._M_p,0x639);
}

Assistant:

void Bloaty::AddDebugFilename(const std::string& filename) {
  auto object_file = GetObjectFile(filename);
  std::string build_id = object_file->GetBuildId();
  if (build_id.size() == 0) {
    THROWF("File '$0' has no build ID, cannot be used as a debug file",
           filename);
  }
  debug_files_[build_id] = filename;
}